

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_packbits.c
# Opt level: O1

int TIFFInitPackBits(TIFF *tif,int scheme)

{
  tif->tif_decoderow = PackBitsDecode;
  tif->tif_decodestrip = PackBitsDecode;
  tif->tif_decodetile = PackBitsDecode;
  tif->tif_preencode = PackBitsPreEncode;
  tif->tif_postencode = PackBitsPostEncode;
  tif->tif_encoderow = PackBitsEncode;
  tif->tif_encodestrip = PackBitsEncodeChunk;
  tif->tif_encodetile = PackBitsEncodeChunk;
  return 1;
}

Assistant:

int TIFFInitPackBits(TIFF *tif, int scheme)
{
    (void)scheme;
    tif->tif_decoderow = PackBitsDecode;
    tif->tif_decodestrip = PackBitsDecode;
    tif->tif_decodetile = PackBitsDecode;
    tif->tif_preencode = PackBitsPreEncode;
    tif->tif_postencode = PackBitsPostEncode;
    tif->tif_encoderow = PackBitsEncode;
    tif->tif_encodestrip = PackBitsEncodeChunk;
    tif->tif_encodetile = PackBitsEncodeChunk;
    return (1);
}